

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_1_8_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  float *pfVar25;
  int iVar26;
  float *data;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  long lVar36;
  float *pfVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  float *pfVar45;
  int k_count;
  byte bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar84 [12];
  undefined1 auVar83 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar85 [16];
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  int data_width;
  int l0_1;
  int l_count0_1;
  int l0;
  int l_count0;
  float local_d8;
  
  auVar54._8_4_ = 0x80000000;
  auVar54._0_8_ = 0x8000000080000000;
  auVar54._12_4_ = 0x80000000;
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  fVar62 = ipoint->scale;
  auVar88 = ZEXT464((uint)fVar62);
  auVar47 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)fVar62),auVar54,0xf8);
  auVar47 = ZEXT416((uint)(fVar62 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  iVar42 = (int)auVar47._0_4_;
  fVar60 = -0.08 / (fVar62 * fVar62);
  auVar48 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->x),auVar54,0xf8);
  auVar48 = ZEXT416((uint)(ipoint->x + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar50._0_8_ = (double)auVar48._0_4_;
  auVar50._8_8_ = auVar48._8_8_;
  auVar53._0_8_ = (double)fVar62;
  auVar53._8_8_ = 0;
  auVar48 = vfmadd231sd_fma(auVar50,auVar53,ZEXT816(0x3fe0000000000000));
  auVar52._0_4_ = (float)auVar48._0_8_;
  auVar52._4_12_ = auVar48._4_12_;
  auVar48 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->y),auVar54,0xf8);
  auVar48 = ZEXT416((uint)(ipoint->y + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49._0_8_ = (double)auVar48._0_4_;
  auVar49._8_8_ = auVar48._8_8_;
  auVar48 = vfmadd231sd_fma(auVar49,auVar53,ZEXT816(0x3fe0000000000000));
  auVar51._0_4_ = (float)auVar48._0_8_;
  auVar51._4_12_ = auVar48._4_12_;
  auVar48._0_4_ = (int)auVar47._0_4_;
  auVar48._4_4_ = (int)auVar47._4_4_;
  auVar48._8_4_ = (int)auVar47._8_4_;
  auVar48._12_4_ = (int)auVar47._12_4_;
  auVar47 = vcvtdq2ps_avx(auVar48);
  fVar3 = auVar52._0_4_ - auVar47._0_4_;
  auVar50 = ZEXT416((uint)fVar3);
  fVar4 = auVar51._0_4_ - auVar47._0_4_;
  auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar62),auVar52);
  auVar48 = vpternlogd_avx512vl(auVar55,auVar47,auVar54,0xf8);
  auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = ZEXT416((uint)fVar62);
  if (iVar42 < (int)auVar47._0_4_) {
    auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar48,auVar51);
    auVar56._8_4_ = 0x3effffff;
    auVar56._0_8_ = 0x3effffff3effffff;
    auVar56._12_4_ = 0x3effffff;
    auVar57._8_4_ = 0x80000000;
    auVar57._0_8_ = 0x8000000080000000;
    auVar57._12_4_ = 0x80000000;
    auVar49 = vpternlogd_avx512vl(auVar57,auVar47,auVar56,0xea);
    auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar49._0_4_));
    auVar47 = vroundss_avx(auVar47,auVar47,0xb);
    if (iVar42 < (int)auVar47._0_4_) {
      auVar47 = vfmadd231ss_fma(auVar52,auVar48,ZEXT416(0x41300000));
      auVar58._8_4_ = 0x80000000;
      auVar58._0_8_ = 0x8000000080000000;
      auVar58._12_4_ = 0x80000000;
      auVar49 = vpternlogd_avx512vl(auVar58,auVar47,auVar56,0xea);
      auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar49._0_4_));
      auVar47 = vroundss_avx(auVar47,auVar47,0xb);
      if ((int)auVar47._0_4_ + iVar42 <= iimage->width) {
        auVar47 = vfmadd231ss_fma(auVar51,auVar48,ZEXT416(0x41300000));
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar49 = vpternlogd_avx512vl(auVar56,auVar47,auVar12,0xf8);
        auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar49._0_4_));
        auVar47 = vroundss_avx(auVar47,auVar47,0xb);
        if ((int)auVar47._0_4_ + iVar42 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar37 = iimage->data;
          iVar1 = iimage->data_width;
          iVar16 = iVar42 * 2;
          pfVar25 = haarResponseY + 7;
          pfVar45 = haarResponseX + 7;
          iVar33 = -0xc;
          lVar22 = 0;
          do {
            auVar47._0_4_ = (float)iVar33;
            auVar47._4_12_ = in_ZMM9._4_12_;
            auVar47 = vfmadd213ss_fma(auVar47,auVar48,ZEXT416((uint)(fVar4 + 0.5)));
            iVar17 = (int)auVar47._0_4_;
            iVar18 = (iVar17 + -1) * iVar1;
            iVar19 = (iVar17 + -1 + iVar42) * iVar1;
            iVar17 = (iVar17 + -1 + iVar16) * iVar1;
            lVar30 = 0;
            do {
              iVar26 = (int)lVar30;
              auVar73._0_4_ = (float)(iVar26 + -0xc);
              auVar84 = in_ZMM10._4_12_;
              auVar73._4_12_ = auVar84;
              auVar47 = vfmadd213ss_fma(auVar73,auVar48,ZEXT416((uint)fVar3));
              iVar32 = (int)auVar47._0_4_;
              auVar85._0_4_ = (float)(iVar26 + -0xb);
              auVar85._4_12_ = in_ZMM9._4_12_;
              auVar47 = vfmadd213ss_fma(auVar85,auVar48,ZEXT416((uint)fVar3));
              auVar83._0_4_ = (float)(iVar26 + -10);
              auVar83._4_12_ = auVar84;
              auVar82._0_4_ = (float)(iVar26 + -9);
              auVar82._4_12_ = auVar84;
              auVar80._0_4_ = (float)(iVar26 + -8);
              auVar80._4_12_ = auVar84;
              auVar79._0_4_ = (float)(iVar26 + -7);
              auVar79._4_12_ = auVar84;
              auVar76._0_4_ = (float)(iVar26 + -6);
              auVar76._4_12_ = auVar84;
              auVar74._0_4_ = (float)(iVar26 + -5);
              auVar74._4_12_ = auVar84;
              iVar43 = iVar32 + -1 + iVar42;
              iVar40 = iVar32 + -1 + iVar16;
              fVar62 = pfVar37[iVar19 + -1 + iVar32];
              fVar61 = pfVar37[iVar17 + -1 + iVar32];
              fVar66 = pfVar37[iVar40 + iVar17];
              iVar20 = (int)auVar47._0_4_;
              auVar49 = ZEXT416((uint)fVar3);
              auVar47 = vfmadd213ss_fma(auVar83,auVar48,auVar49);
              fVar70 = pfVar37[iVar18 + -1 + iVar32];
              fVar77 = pfVar37[iVar18 + iVar40];
              auVar51 = SUB6416(ZEXT464(0x40000000),0);
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + iVar43] -
                                                      pfVar37[iVar43 + iVar17])),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              fVar67 = pfVar37[iVar19 + iVar40];
              pfVar45[lVar30 + -7] = (fVar61 - fVar77) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              pfVar25[lVar30 + -7] = auVar50._0_4_ - (fVar61 - fVar77);
              iVar43 = iVar20 + -1 + iVar42;
              iVar40 = iVar20 + -1 + iVar16;
              fVar62 = pfVar37[iVar19 + -1 + iVar20];
              fVar61 = pfVar37[iVar17 + -1 + iVar20];
              fVar66 = pfVar37[iVar40 + iVar17];
              iVar32 = (int)auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(auVar82,auVar48,auVar49);
              fVar70 = pfVar37[iVar18 + -1 + iVar20];
              fVar77 = pfVar37[iVar18 + iVar40];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + iVar43] -
                                                      pfVar37[iVar43 + iVar17])),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              fVar67 = pfVar37[iVar19 + iVar40];
              pfVar45[lVar30 + -6] = (fVar61 - fVar77) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              pfVar25[lVar30 + -6] = auVar50._0_4_ - (fVar61 - fVar77);
              iVar43 = iVar32 + -1 + iVar42;
              iVar40 = iVar32 + -1 + iVar16;
              fVar62 = pfVar37[iVar19 + -1 + iVar32];
              fVar61 = pfVar37[iVar17 + -1 + iVar32];
              fVar66 = pfVar37[iVar40 + iVar17];
              iVar20 = (int)auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(auVar80,auVar48,auVar49);
              fVar70 = pfVar37[iVar18 + -1 + iVar32];
              fVar77 = pfVar37[iVar18 + iVar40];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + iVar43] -
                                                      pfVar37[iVar43 + iVar17])),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              fVar67 = pfVar37[iVar19 + iVar40];
              pfVar45[lVar30 + -5] = (fVar61 - fVar77) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              pfVar25[lVar30 + -5] = auVar50._0_4_ - (fVar61 - fVar77);
              iVar43 = iVar20 + -1 + iVar42;
              iVar40 = iVar20 + -1 + iVar16;
              fVar62 = pfVar37[iVar19 + -1 + iVar20];
              fVar61 = pfVar37[iVar17 + -1 + iVar20];
              in_ZMM10 = ZEXT464((uint)pfVar37[iVar40 + iVar17]);
              iVar32 = (int)auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(auVar79,auVar48,auVar49);
              fVar66 = pfVar37[iVar18 + iVar40];
              auVar49 = ZEXT416((uint)(pfVar37[iVar40 + iVar17] - pfVar37[iVar18 + -1 + iVar20]));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + iVar43] -
                                                      pfVar37[iVar43 + iVar17])),auVar51,auVar49);
              fVar70 = pfVar37[iVar19 + iVar40];
              pfVar45[lVar30 + -4] = (fVar61 - fVar66) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar70)),auVar51,auVar49);
              pfVar25[lVar30 + -4] = auVar50._0_4_ - (fVar61 - fVar66);
              iVar43 = iVar32 + -1 + iVar42;
              iVar40 = iVar32 + -1 + iVar16;
              fVar62 = pfVar37[iVar19 + -1 + iVar32];
              fVar61 = pfVar37[iVar17 + -1 + iVar32];
              in_ZMM9 = ZEXT464((uint)pfVar37[iVar40 + iVar17]);
              iVar20 = (int)auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(auVar76,auVar48,ZEXT416((uint)fVar3));
              fVar66 = pfVar37[iVar18 + iVar40];
              auVar49 = ZEXT416((uint)(pfVar37[iVar40 + iVar17] - pfVar37[iVar18 + -1 + iVar32]));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + iVar43] -
                                                      pfVar37[iVar43 + iVar17])),auVar51,auVar49);
              fVar70 = pfVar37[iVar19 + iVar40];
              pfVar45[lVar30 + -3] = (fVar61 - fVar66) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar70)),auVar51,auVar49);
              pfVar25[lVar30 + -3] = auVar50._0_4_ - (fVar61 - fVar66);
              iVar43 = iVar20 + -1 + iVar42;
              iVar40 = iVar20 + -1 + iVar16;
              fVar62 = pfVar37[iVar19 + -1 + iVar20];
              fVar61 = pfVar37[iVar17 + -1 + iVar20];
              fVar66 = pfVar37[iVar40 + iVar17];
              iVar32 = (int)auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(auVar74,auVar48,ZEXT416((uint)fVar3));
              fVar70 = pfVar37[iVar18 + -1 + iVar20];
              fVar77 = pfVar37[iVar18 + iVar40];
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + iVar43] -
                                                      pfVar37[iVar43 + iVar17])),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              fVar67 = pfVar37[iVar19 + iVar40];
              pfVar45[lVar30 + -2] = (fVar61 - fVar77) + auVar50._0_4_;
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              pfVar25[lVar30 + -2] = auVar50._0_4_ - (fVar61 - fVar77);
              iVar43 = iVar32 + -1 + iVar42;
              iVar40 = iVar32 + -1 + iVar16;
              fVar62 = pfVar37[iVar19 + -1 + iVar32];
              fVar61 = pfVar37[iVar17 + -1 + iVar32];
              fVar66 = pfVar37[iVar40 + iVar17];
              iVar20 = (int)auVar47._0_4_;
              fVar70 = pfVar37[iVar18 + -1 + iVar32];
              fVar77 = pfVar37[iVar18 + iVar40];
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + iVar43] -
                                                      pfVar37[iVar43 + iVar17])),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              fVar67 = pfVar37[iVar19 + iVar40];
              pfVar45[lVar30 + -1] = (fVar61 - fVar77) + auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              iVar43 = iVar20 + -1 + iVar42;
              iVar40 = iVar20 + -1 + iVar16;
              pfVar25[lVar30 + -1] = auVar47._0_4_ - (fVar61 - fVar77);
              fVar62 = pfVar37[iVar19 + -1 + iVar20];
              fVar61 = pfVar37[iVar17 + -1 + iVar20];
              fVar66 = pfVar37[iVar40 + iVar17];
              fVar70 = pfVar37[iVar18 + -1 + iVar20];
              fVar77 = pfVar37[iVar18 + iVar40];
              fVar67 = pfVar37[iVar19 + iVar40];
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + iVar43] -
                                                      pfVar37[iVar43 + iVar17])),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              pfVar45[lVar30] = (fVar61 - fVar77) + auVar47._0_4_;
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar62 - fVar67)),auVar51,
                                        ZEXT416((uint)(fVar66 - fVar70)));
              pfVar25[lVar30] = auVar47._0_4_ - (fVar61 - fVar77);
              lVar30 = lVar30 + 8;
            } while (iVar26 + -0xc < 4);
            iVar33 = iVar33 + 1;
            lVar22 = lVar22 + 1;
            pfVar25 = pfVar25 + 0x18;
            pfVar45 = pfVar45 + 0x18;
          } while (lVar22 != 0x18);
          goto LAB_001aa52f;
        }
      }
    }
  }
  iVar1 = iVar42 * 2;
  iVar16 = -0xc;
  lVar30 = 0;
  lVar22 = 0;
  do {
    auVar63._0_4_ = (float)iVar16;
    auVar63._4_12_ = in_ZMM8._4_12_;
    auVar47 = vfmadd213ss_fma(auVar63,auVar88._0_16_,ZEXT416((uint)fVar4));
    fVar61 = auVar47._0_4_;
    iVar40 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
    iVar17 = iVar1 + iVar40;
    iVar18 = iVar40 + -1;
    iVar19 = iVar40 + -1 + iVar42;
    lVar29 = lVar30;
    iVar33 = -0xc;
    do {
      auVar64._0_4_ = (float)iVar33;
      auVar84 = in_ZMM8._4_12_;
      auVar64._4_12_ = auVar84;
      auVar51 = auVar88._0_16_;
      auVar47 = vfmadd213ss_fma(auVar64,auVar51,auVar50);
      auVar78._0_4_ = (float)(iVar33 + 1);
      auVar78._4_12_ = auVar84;
      auVar49 = vfmadd213ss_fma(auVar78,auVar51,auVar50);
      fVar77 = auVar49._0_4_;
      auVar71._0_4_ = (float)(iVar33 + 2);
      auVar71._4_12_ = auVar84;
      auVar49 = vfmadd213ss_fma(auVar71,auVar51,auVar50);
      auVar68._0_4_ = (float)(iVar33 + 3);
      auVar68._4_12_ = auVar84;
      auVar51 = vfmadd213ss_fma(auVar68,auVar51,auVar50);
      fVar61 = auVar47._0_4_;
      fVar70 = auVar49._0_4_;
      fVar66 = auVar51._0_4_;
      pfVar37 = (float *)((long)haarResponseY + lVar29);
      iVar26 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
      if ((((iVar40 < 1) || (iVar26 < 1)) || (iimage->height < iVar17)) ||
         (iVar20 = iVar1 + iVar26, iimage->width < iVar20)) {
        haarXY(iimage,iVar40,iVar26,iVar42,(float *)((long)haarResponseX + lVar29),pfVar37);
      }
      else {
        iVar32 = iVar26 + -1 + iVar42;
        pfVar45 = iimage->data;
        iVar43 = iimage->data_width;
        iVar39 = iVar43 * iVar18;
        fVar61 = pfVar45[iVar43 * iVar19 + -1 + iVar26];
        iVar34 = iVar43 * (iVar1 + -1 + iVar40);
        fVar67 = pfVar45[iVar34 + -1 + iVar26];
        fVar5 = pfVar45[iVar34 + -1 + iVar20];
        fVar6 = pfVar45[iVar39 + -1 + iVar26];
        fVar7 = pfVar45[iVar39 + -1 + iVar20];
        fVar8 = pfVar45[iVar43 * iVar19 + -1 + iVar20];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar39 + iVar32] - pfVar45[iVar34 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *(float *)((long)haarResponseX + lVar29) = (fVar67 - fVar7) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar37 = auVar47._0_4_ - (fVar67 - fVar7);
      }
      iVar26 = (int)((double)((ulong)(0.0 <= fVar77) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar77) * -0x4020000000000000) + (double)fVar77);
      pfVar37 = (float *)((long)haarResponseX + lVar29 + 4);
      pfVar45 = (float *)((long)haarResponseY + lVar29 + 4);
      if (((iVar40 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar17 || (iVar20 = iVar1 + iVar26, iimage->width < iVar20)))) {
        haarXY(iimage,iVar40,iVar26,iVar42,pfVar37,pfVar45);
      }
      else {
        iVar39 = iVar26 + -1 + iVar42;
        pfVar25 = iimage->data;
        iVar43 = iimage->data_width;
        iVar34 = iVar43 * iVar18;
        fVar61 = pfVar25[iVar43 * iVar19 + -1 + iVar26];
        iVar32 = iVar43 * (iVar1 + -1 + iVar40);
        fVar77 = pfVar25[iVar32 + -1 + iVar26];
        fVar67 = pfVar25[iVar32 + -1 + iVar20];
        fVar5 = pfVar25[iVar34 + -1 + iVar26];
        fVar6 = pfVar25[iVar34 + -1 + iVar20];
        fVar7 = pfVar25[iVar43 * iVar19 + -1 + iVar20];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar25[iVar34 + iVar39] - pfVar25[iVar32 + iVar39]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar67 - fVar5)));
        *pfVar37 = (fVar77 - fVar6) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar67 - fVar5)));
        *pfVar45 = auVar47._0_4_ - (fVar77 - fVar6);
      }
      iVar26 = (int)((double)((ulong)(0.0 <= fVar70) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar70) * -0x4020000000000000) + (double)fVar70);
      pfVar37 = (float *)((long)haarResponseX + lVar29 + 8);
      pfVar45 = (float *)((long)haarResponseY + lVar29 + 8);
      if (((iVar40 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar17 || (iVar20 = iVar1 + iVar26, iimage->width < iVar20)))) {
        haarXY(iimage,iVar40,iVar26,iVar42,pfVar37,pfVar45);
      }
      else {
        iVar32 = iVar26 + -1 + iVar42;
        pfVar25 = iimage->data;
        iVar43 = iimage->data_width;
        iVar39 = iVar43 * iVar18;
        fVar61 = pfVar25[iVar43 * iVar19 + -1 + iVar26];
        iVar34 = iVar43 * (iVar1 + -1 + iVar40);
        fVar70 = pfVar25[iVar34 + -1 + iVar26];
        fVar77 = pfVar25[iVar34 + -1 + iVar20];
        fVar67 = pfVar25[iVar39 + -1 + iVar26];
        fVar5 = pfVar25[iVar39 + -1 + iVar20];
        fVar6 = pfVar25[iVar43 * iVar19 + -1 + iVar20];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar25[iVar39 + iVar32] - pfVar25[iVar34 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar77 - fVar67)));
        *pfVar37 = (fVar70 - fVar5) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar6)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar77 - fVar67)));
        *pfVar45 = auVar47._0_4_ - (fVar70 - fVar5);
      }
      iVar26 = (int)((double)((ulong)(0.0 <= fVar66) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar66) * -0x4020000000000000) + (double)fVar66);
      pfVar37 = (float *)((long)haarResponseX + lVar29 + 0xc);
      pfVar45 = (float *)((long)haarResponseY + lVar29 + 0xc);
      if ((((iVar40 < 1) || (iVar26 < 1)) || (iimage->height < iVar17)) ||
         (iVar20 = iVar1 + iVar26, iimage->width < iVar20)) {
        haarXY(iimage,iVar40,iVar26,iVar42,pfVar37,pfVar45);
      }
      else {
        iVar32 = iVar26 + -1 + iVar42;
        pfVar25 = iimage->data;
        iVar43 = iimage->data_width;
        iVar39 = iVar43 * iVar18;
        fVar61 = pfVar25[iVar43 * iVar19 + -1 + iVar26];
        iVar34 = iVar43 * (iVar1 + -1 + iVar40);
        fVar66 = pfVar25[iVar34 + -1 + iVar26];
        fVar70 = pfVar25[iVar34 + -1 + iVar20];
        fVar77 = pfVar25[iVar39 + -1 + iVar26];
        fVar67 = pfVar25[iVar39 + -1 + iVar20];
        fVar5 = pfVar25[iVar43 * iVar19 + -1 + iVar20];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar25[iVar39 + iVar32] - pfVar25[iVar34 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar37 = (fVar66 - fVar67) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar45 = auVar47._0_4_ - (fVar66 - fVar67);
      }
      auVar47 = vpbroadcastd_avx512vl();
      auVar47 = vpaddd_avx(auVar47,_DAT_005766f0);
      auVar47 = vcvtdq2ps_avx(auVar47);
      auVar14._4_4_ = fVar3;
      auVar14._0_4_ = fVar3;
      auVar14._8_4_ = fVar3;
      auVar14._12_4_ = fVar3;
      auVar15._4_4_ = fVar62;
      auVar15._0_4_ = fVar62;
      auVar15._8_4_ = fVar62;
      auVar15._12_4_ = fVar62;
      auVar49 = vfmadd132ps_fma(auVar47,auVar14,auVar15);
      auVar47 = vshufps_avx(auVar49,auVar49,0xff);
      uVar23 = vcmpps_avx512vl(auVar49,_DAT_00576190,0xd);
      bVar46 = (byte)(uVar23 >> 3);
      iVar26 = (int)((double)((ulong)(bVar46 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar46 & 1) * -0x4020000000000000) +
                    (double)auVar47._0_4_);
      pfVar37 = (float *)((long)haarResponseX + lVar29 + 0x10);
      pfVar45 = (float *)((long)haarResponseY + lVar29 + 0x10);
      if (((iVar40 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar17 || (iVar20 = iVar1 + iVar26, iimage->width < iVar20)))) {
        haarXY(iimage,iVar40,iVar26,iVar42,pfVar37,pfVar45);
      }
      else {
        iVar32 = iVar26 + -1 + iVar42;
        pfVar25 = iimage->data;
        iVar43 = iimage->data_width;
        iVar39 = iVar43 * iVar18;
        fVar61 = pfVar25[iVar43 * iVar19 + -1 + iVar26];
        iVar34 = iVar43 * (iVar1 + -1 + iVar40);
        fVar66 = pfVar25[iVar34 + -1 + iVar26];
        fVar70 = pfVar25[iVar34 + -1 + iVar20];
        fVar77 = pfVar25[iVar39 + -1 + iVar26];
        fVar67 = pfVar25[iVar39 + -1 + iVar20];
        fVar5 = pfVar25[iVar43 * iVar19 + -1 + iVar20];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar25[iVar39 + iVar32] - pfVar25[iVar34 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar37 = (fVar66 - fVar67) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar45 = auVar47._0_4_ - (fVar66 - fVar67);
      }
      bVar46 = (byte)uVar23;
      auVar47 = vpermilpd_avx(auVar49,1);
      iVar26 = (int)((double)((ulong)(bVar46 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar46 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar47._0_4_);
      pfVar37 = (float *)((long)haarResponseX + lVar29 + 0x14);
      pfVar45 = (float *)((long)haarResponseY + lVar29 + 0x14);
      if (((iVar40 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar17 || (iVar20 = iVar1 + iVar26, iimage->width < iVar20)))) {
        haarXY(iimage,iVar40,iVar26,iVar42,pfVar37,pfVar45);
      }
      else {
        iVar32 = iVar26 + -1 + iVar42;
        pfVar25 = iimage->data;
        iVar43 = iimage->data_width;
        iVar39 = iVar43 * iVar18;
        fVar61 = pfVar25[iVar43 * iVar19 + -1 + iVar26];
        iVar34 = iVar43 * (iVar1 + -1 + iVar40);
        fVar66 = pfVar25[iVar34 + -1 + iVar26];
        fVar70 = pfVar25[iVar34 + -1 + iVar20];
        fVar77 = pfVar25[iVar39 + -1 + iVar26];
        fVar67 = pfVar25[iVar39 + -1 + iVar20];
        fVar5 = pfVar25[iVar43 * iVar19 + -1 + iVar20];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar25[iVar39 + iVar32] - pfVar25[iVar34 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar37 = (fVar66 - fVar67) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar45 = auVar47._0_4_ - (fVar66 - fVar67);
      }
      auVar47 = vmovshdup_avx(auVar49);
      iVar26 = (int)((double)((ulong)(bVar46 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar46 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar47._0_4_);
      pfVar37 = (float *)((long)haarResponseX + lVar29 + 0x18);
      pfVar45 = (float *)((long)haarResponseY + lVar29 + 0x18);
      if ((((iVar40 < 1) || (iVar26 < 1)) || (iimage->height < iVar17)) ||
         (iVar20 = iVar1 + iVar26, iimage->width < iVar20)) {
        haarXY(iimage,iVar40,iVar26,iVar42,pfVar37,pfVar45);
      }
      else {
        iVar32 = iVar26 + -1 + iVar42;
        pfVar25 = iimage->data;
        iVar43 = iimage->data_width;
        iVar39 = iVar43 * iVar18;
        fVar61 = pfVar25[iVar43 * iVar19 + -1 + iVar26];
        iVar34 = iVar43 * (iVar1 + -1 + iVar40);
        fVar66 = pfVar25[iVar34 + -1 + iVar26];
        fVar70 = pfVar25[iVar34 + -1 + iVar20];
        fVar77 = pfVar25[iVar39 + -1 + iVar26];
        fVar67 = pfVar25[iVar39 + -1 + iVar20];
        fVar5 = pfVar25[iVar43 * iVar19 + -1 + iVar20];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar25[iVar39 + iVar32] - pfVar25[iVar34 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar37 = (fVar66 - fVar67) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar45 = auVar47._0_4_ - (fVar66 - fVar67);
      }
      local_d8 = auVar49._0_4_;
      iVar26 = (int)((double)((ulong)(bVar46 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar46 & 1) * -0x4020000000000000) + (double)local_d8);
      pfVar37 = (float *)((long)haarResponseX + lVar29 + 0x1c);
      pfVar45 = (float *)((long)haarResponseY + lVar29 + 0x1c);
      if (((iVar40 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar17 || (iVar20 = iVar1 + iVar26, iimage->width < iVar20)))) {
        haarXY(iimage,iVar40,iVar26,iVar42,pfVar37,pfVar45);
      }
      else {
        iVar32 = iVar26 + -1 + iVar42;
        pfVar25 = iimage->data;
        iVar43 = iimage->data_width;
        iVar39 = iVar43 * iVar18;
        fVar61 = pfVar25[iVar43 * iVar19 + -1 + iVar26];
        iVar34 = iVar43 * (iVar1 + -1 + iVar40);
        fVar66 = pfVar25[iVar34 + -1 + iVar26];
        fVar70 = pfVar25[iVar34 + -1 + iVar20];
        fVar77 = pfVar25[iVar39 + -1 + iVar26];
        fVar67 = pfVar25[iVar39 + -1 + iVar20];
        fVar5 = pfVar25[iVar43 * iVar19 + -1 + iVar20];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar25[iVar39 + iVar32] - pfVar25[iVar34 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar37 = (fVar66 - fVar67) + auVar47._0_4_;
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(fVar61 - fVar5)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar70 - fVar77)));
        *pfVar45 = auVar47._0_4_ - (fVar66 - fVar67);
      }
      auVar88 = ZEXT1664(auVar48);
      lVar29 = lVar29 + 0x20;
      bVar2 = iVar33 < 4;
      iVar33 = iVar33 + 8;
    } while (bVar2);
    iVar16 = iVar16 + 1;
    lVar22 = lVar22 + 1;
    lVar30 = lVar30 + 0x60;
  } while (lVar22 != 0x18);
LAB_001aa52f:
  fVar62 = auVar88._0_4_;
  auVar87._8_4_ = 0x3effffff;
  auVar87._0_8_ = 0x3effffff3effffff;
  auVar87._12_4_ = 0x3effffff;
  auVar86._8_4_ = 0x80000000;
  auVar86._0_8_ = 0x8000000080000000;
  auVar86._12_4_ = 0x80000000;
  auVar47 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 0.5)),auVar86,0xf8);
  auVar47 = ZEXT416((uint)(fVar62 * 0.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 1.5)),auVar86,0xf8);
  auVar48 = ZEXT416((uint)(fVar62 * 1.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar50 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 2.5)),auVar86,0xf8);
  auVar50 = ZEXT416((uint)(fVar62 * 2.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar49 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 3.5)),auVar86,0xf8);
  auVar49 = ZEXT416((uint)(fVar62 * 3.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar51 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 4.5)),auVar86,0xf8);
  auVar51 = ZEXT416((uint)(fVar62 * 4.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 5.5)),auVar86,0xf8);
  auVar52 = ZEXT416((uint)(fVar62 * 5.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 6.5)),auVar86,0xf8);
  auVar53 = ZEXT416((uint)(fVar62 * 6.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 7.5)),auVar86,0xf8);
  auVar54 = ZEXT416((uint)(auVar54._0_4_ + fVar62 * 7.5));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 8.5)),auVar86,0xf8);
  auVar55 = ZEXT416((uint)(fVar62 * 8.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 9.5)),auVar86,0xf8);
  auVar56 = ZEXT416((uint)(fVar62 * 9.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 10.5)),auVar86,0xf8);
  auVar57 = ZEXT416((uint)(fVar62 * 10.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar87,ZEXT416((uint)(fVar62 * 11.5)),auVar86,0xf8);
  auVar58 = ZEXT416((uint)(fVar62 * 11.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  fVar67 = auVar50._0_4_;
  fVar62 = fVar67 + auVar48._0_4_;
  fVar3 = fVar67 + auVar47._0_4_;
  fVar4 = fVar67 - auVar47._0_4_;
  fVar61 = fVar67 - auVar48._0_4_;
  fVar66 = fVar67 - auVar49._0_4_;
  fVar70 = fVar67 - auVar51._0_4_;
  fVar77 = fVar67 - auVar52._0_4_;
  fVar67 = fVar67 - auVar53._0_4_;
  fVar81 = auVar54._0_4_;
  fVar5 = fVar81 - auVar49._0_4_;
  fVar6 = fVar81 - auVar51._0_4_;
  fVar7 = fVar81 - auVar52._0_4_;
  fVar8 = fVar81 - auVar53._0_4_;
  fVar9 = fVar81 - auVar55._0_4_;
  fVar10 = fVar81 - auVar56._0_4_;
  fVar11 = fVar81 - auVar57._0_4_;
  fVar81 = fVar81 - auVar58._0_4_;
  gauss_s1_c0[0] = expf(fVar62 * fVar62 * fVar60);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar60);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar60);
  gauss_s1_c0[3] = expf(fVar61 * fVar61 * fVar60);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar66 * fVar66 * fVar60);
  gauss_s1_c0[6] = expf(fVar70 * fVar70 * fVar60);
  gauss_s1_c0[7] = expf(fVar77 * fVar77 * fVar60);
  gauss_s1_c0[8] = expf(fVar67 * fVar67 * fVar60);
  gauss_s1_c1[0] = expf(fVar5 * fVar5 * fVar60);
  gauss_s1_c1[1] = expf(fVar6 * fVar6 * fVar60);
  gauss_s1_c1[2] = expf(fVar7 * fVar7 * fVar60);
  gauss_s1_c1[3] = expf(fVar8 * fVar8 * fVar60);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar9 * fVar9 * fVar60);
  gauss_s1_c1[6] = expf(fVar10 * fVar10 * fVar60);
  gauss_s1_c1[7] = expf(fVar11 * fVar11 * fVar60);
  gauss_s1_c1[8] = expf(fVar81 * fVar81 * fVar60);
  uVar23 = 0xfffffff8;
  lVar22 = 0;
  fVar62 = 0.0;
  auVar65._8_4_ = 0x7fffffff;
  auVar65._0_8_ = 0x7fffffff7fffffff;
  auVar65._12_4_ = 0x7fffffff;
  lVar30 = 0;
  lVar29 = 0;
  do {
    pfVar37 = gauss_s1_c1;
    uVar21 = (uint)uVar23;
    if (uVar21 != 7) {
      pfVar37 = gauss_s1_c0;
    }
    if (uVar21 == 0xfffffff8) {
      pfVar37 = gauss_s1_c1;
    }
    lVar30 = (long)(int)lVar30;
    iVar42 = (int)lVar29;
    lVar29 = (long)iVar42;
    lVar36 = (long)haarResponseX + lVar22;
    lVar28 = (long)haarResponseY + lVar22;
    uVar35 = 0xfffffff8;
    uVar31 = 0;
    do {
      pfVar45 = gauss_s1_c1;
      if (uVar35 != 7) {
        pfVar45 = gauss_s1_c0;
      }
      if (uVar35 == 0xfffffff8) {
        pfVar45 = gauss_s1_c1;
      }
      uVar24 = (ulong)(uVar35 >> 0x1c & 0xfffffff8);
      auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar27 = uVar31;
      lVar41 = lVar36;
      lVar44 = lVar28;
      do {
        lVar38 = 0;
        pfVar25 = (float *)((long)pfVar37 + (ulong)(uint)((int)(uVar23 >> 0x1f) << 5));
        do {
          fVar3 = pfVar45[uVar24] * *pfVar25;
          auVar47 = vinsertps_avx(ZEXT416(*(uint *)(lVar44 + lVar38 * 4)),
                                  ZEXT416(*(uint *)(lVar41 + lVar38 * 4)),0x10);
          auVar75._0_4_ = fVar3 * auVar47._0_4_;
          auVar75._4_4_ = fVar3 * auVar47._4_4_;
          auVar75._8_4_ = fVar3 * auVar47._8_4_;
          auVar75._12_4_ = fVar3 * auVar47._12_4_;
          auVar47 = vandps_avx(auVar75,auVar65);
          auVar47 = vmovlhps_avx(auVar75,auVar47);
          auVar69._0_4_ = auVar88._0_4_ + auVar47._0_4_;
          auVar69._4_4_ = auVar88._4_4_ + auVar47._4_4_;
          auVar69._8_4_ = auVar88._8_4_ + auVar47._8_4_;
          auVar69._12_4_ = auVar88._12_4_ + auVar47._12_4_;
          auVar88 = ZEXT1664(auVar69);
          pfVar25 = pfVar25 + (ulong)(~uVar21 >> 0x1f) * 2 + -1;
          lVar38 = lVar38 + 1;
        } while (lVar38 != 9);
        uVar27 = uVar27 + 0x18;
        uVar24 = uVar24 + (ulong)(-1 < (int)uVar35) * 2 + -1;
        lVar41 = lVar41 + 0x60;
        lVar44 = lVar44 + 0x60;
      } while (uVar27 < uVar35 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar29];
      auVar13._4_4_ = fVar3;
      auVar13._0_4_ = fVar3;
      auVar13._8_4_ = fVar3;
      auVar13._12_4_ = fVar3;
      auVar50 = vmulps_avx512vl(auVar69,auVar13);
      lVar29 = lVar29 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar30) = auVar50;
      auVar72._0_4_ = auVar50._0_4_ * auVar50._0_4_;
      auVar72._4_4_ = auVar50._4_4_ * auVar50._4_4_;
      auVar72._8_4_ = auVar50._8_4_ * auVar50._8_4_;
      auVar72._12_4_ = auVar50._12_4_ * auVar50._12_4_;
      auVar47 = vmovshdup_avx(auVar72);
      auVar48 = vfmadd231ss_fma(auVar47,auVar50,auVar50);
      auVar47 = vshufpd_avx(auVar50,auVar50,1);
      auVar48 = vfmadd213ss_fma(auVar47,auVar47,auVar48);
      auVar47 = vshufps_avx(auVar50,auVar50,0xff);
      auVar47 = vfmadd213ss_fma(auVar47,auVar47,auVar48);
      fVar62 = fVar62 + auVar47._0_4_;
      lVar30 = lVar30 + 4;
      uVar35 = uVar35 + 5;
      uVar31 = uVar31 + 0x78;
      lVar36 = lVar36 + 0x1e0;
      lVar28 = lVar28 + 0x1e0;
    } while (iVar42 + 4 != (int)lVar29);
    lVar22 = lVar22 + 0x14;
    uVar23 = (ulong)(uVar21 + 5);
  } while ((int)uVar21 < 3);
  if (fVar62 < 0.0) {
    fVar62 = sqrtf(fVar62);
  }
  else {
    auVar47 = vsqrtss_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
    fVar62 = auVar47._0_4_;
  }
  auVar88 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar62)));
  lVar22 = 0;
  do {
    auVar59 = vmulps_avx512f(auVar88,*(undefined1 (*) [64])(ipoint->descriptor + lVar22));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar22) = auVar59;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_8_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}